

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<false> * __thiscall
ArrayState<false>::StartObject(ArrayState<false> *this,Context<false> *ctx)

{
  char *ns;
  
  if ((ctx->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (ctx->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ns = " ";
  }
  else {
    ns = (ctx->namespace_path).
         super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].name;
  }
  Context<false>::PushNamespace(ctx,ns,&this->super_BaseState<false>);
  return &(ctx->default_state).super_BaseState<false>;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // parse properties
    ctx.PushNamespace(ctx.namespace_path.size() > 0 ? ctx.CurrentNamespace().name : " ", this);

    return &ctx.default_state;
  }